

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void test_master_table_delete(planck_unit_test_t *tc)

{
  MasterTable *this;
  MasterTable *master_table;
  planck_unit_test_t *tc_local;
  
  this = (MasterTable *)operator_new(0x50);
  MasterTable::MasterTable(this);
  master_table_setup(tc,this);
  master_table_init(tc,this);
  if (this != (MasterTable *)0x0) {
    MasterTable::~MasterTable(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void
test_master_table_delete(
	planck_unit_test_t *tc
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);
	delete master_table;
}